

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharedRenderingPerfTests.cpp
# Opt level: O0

void deqp::egl::anon_unknown_0::anon_unknown_5::createCoordData
               (vector<float,_std::allocator<float>_> *data,TestConfig *config)

{
  float local_84;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  undefined4 local_5c;
  float side_1;
  float y2_1;
  float x2_1;
  float y1_1;
  float x1_1;
  int triangleNdx_1;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  undefined4 local_2c;
  float side;
  float y2;
  float x2;
  float y1;
  float x1;
  int triangleNdx;
  TestConfig *config_local;
  vector<float,_std::allocator<float>_> *data_local;
  
  _x1 = config;
  config_local = (TestConfig *)data;
  if ((config->useIndices & 1U) == 0) {
    std::vector<float,_std::allocator<float>_>::reserve(data,(long)(config->triangleCount * 6));
    for (y1_1 = 0.0; (int)y1_1 < _x1->triangleCount; y1_1 = (float)((int)y1_1 + 1)) {
      x2_1 = -1.0;
      y2_1 = -1.0;
      side_1 = 1.0;
      local_5c = 0x3f800000;
      local_84 = 1.0;
      if ((int)y1_1 % 2 != 0) {
        local_84 = -1.0;
      }
      local_60 = local_84;
      local_64 = local_84 * -1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)config_local,&local_64);
      local_68 = local_60 * -1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)config_local,&local_68);
      local_6c = local_60 * 1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)config_local,&local_6c);
      local_70 = local_60 * -1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)config_local,&local_70);
      local_74 = local_60 * 1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)config_local,&local_74);
      local_78 = local_60 * 1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)config_local,&local_78);
    }
  }
  else {
    for (y1 = 0.0; (int)y1 < 2; y1 = (float)((int)y1 + 1)) {
      x2 = -1.0;
      y2 = -1.0;
      side = 1.0;
      local_2c = 0x3f800000;
      local_7c = 1.0;
      if ((int)y1 % 2 != 0) {
        local_7c = -1.0;
      }
      local_30 = local_7c;
      local_34 = local_7c * -1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)config_local,&local_34);
      local_38 = local_30 * -1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)config_local,&local_38);
      local_3c = local_30 * 1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)config_local,&local_3c);
      local_40 = local_30 * -1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)config_local,&local_40);
      triangleNdx_1 = (int)(local_30 * 1.0);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)config_local,
                 (value_type_conflict4 *)&triangleNdx_1);
      x1_1 = local_30 * 1.0;
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)config_local,&x1_1);
    }
  }
  return;
}

Assistant:

void createCoordData (vector<float>& data, const TestConfig& config)
{
	if (config.useIndices)
	{
		for (int triangleNdx = 0; triangleNdx < 2; triangleNdx++)
		{
			const float x1 = -1.0f;
			const float y1 = -1.0f;

			const float x2 = 1.0f;
			const float y2 = 1.0f;

			const float side = ((triangleNdx % 2) == 0 ? 1.0f : -1.0f);

			data.push_back(side * x1);
			data.push_back(side * y1);

			data.push_back(side * x2);
			data.push_back(side * y1);

			data.push_back(side * x2);
			data.push_back(side * y2);
		}
	}
	else
	{
		data.reserve(config.triangleCount * 3 * 2);

		for (int triangleNdx = 0; triangleNdx < config.triangleCount; triangleNdx++)
		{
			const float x1 = -1.0f;
			const float y1 = -1.0f;

			const float x2 = 1.0f;
			const float y2 = 1.0f;

			const float side = ((triangleNdx % 2) == 0 ? 1.0f : -1.0f);

			data.push_back(side * x1);
			data.push_back(side * y1);

			data.push_back(side * x2);
			data.push_back(side * y1);

			data.push_back(side * x2);
			data.push_back(side * y2);
		}
	}
}